

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIEnvironment::OnPostRender(CGUIEnvironment *this)

{
  u32 in_ESI;
  
  OnPostRender((CGUIEnvironment *)&this[-1].field_0x218,in_ESI);
  return;
}

Assistant:

void CGUIEnvironment::OnPostRender(u32 time)
{
	// launch tooltip
	if (ToolTip.Element == 0 &&
			HoveredNoSubelement && HoveredNoSubelement != this &&
			(time - ToolTip.EnterTime >= ToolTip.LaunchTime || (time - ToolTip.LastTime >= ToolTip.RelaunchTime && time - ToolTip.LastTime < ToolTip.LaunchTime)) &&
			HoveredNoSubelement->getToolTipText().size() &&
			getSkin() &&
			getSkin()->getFont(EGDF_TOOLTIP)) {
		core::rect<s32> pos;

		pos.UpperLeftCorner = LastHoveredMousePos;
		core::dimension2du dim = getSkin()->getFont(EGDF_TOOLTIP)->getDimension(HoveredNoSubelement->getToolTipText().c_str());
		dim.Width += getSkin()->getSize(EGDS_TEXT_DISTANCE_X) * 2;
		dim.Height += getSkin()->getSize(EGDS_TEXT_DISTANCE_Y) * 2;

		pos.UpperLeftCorner.Y -= dim.Height + 1;
		pos.LowerRightCorner.Y = pos.UpperLeftCorner.Y + dim.Height - 1;
		pos.LowerRightCorner.X = pos.UpperLeftCorner.X + dim.Width;

		pos.constrainTo(getAbsolutePosition());

		ToolTip.Element = addStaticText(HoveredNoSubelement->getToolTipText().c_str(), pos, true, true, this, -1, true);
		ToolTip.Element->setOverrideColor(getSkin()->getColor(EGDC_TOOLTIP));
		ToolTip.Element->setBackgroundColor(getSkin()->getColor(EGDC_TOOLTIP_BACKGROUND));
		ToolTip.Element->setOverrideFont(getSkin()->getFont(EGDF_TOOLTIP));
		ToolTip.Element->setSubElement(true);
		ToolTip.Element->grab();

		s32 textHeight = ToolTip.Element->getTextHeight();
		pos = ToolTip.Element->getRelativePosition();
		pos.LowerRightCorner.Y = pos.UpperLeftCorner.Y + textHeight;
		ToolTip.Element->setRelativePosition(pos);
	}

	if (ToolTip.Element && ToolTip.Element->isVisible()) { // (isVisible() check only because we might use visibility for ToolTip one day)
		ToolTip.LastTime = time;

		// got invisible or removed in the meantime?
		if (!HoveredNoSubelement ||
				!HoveredNoSubelement->isVisible() ||
				!HoveredNoSubelement->getParent()) // got invisible or removed in the meantime?
		{
			ToolTip.Element->remove();
			ToolTip.Element->drop();
			ToolTip.Element = 0;
		}
	}

	IGUIElement::OnPostRender(time);
}